

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

void xmlFAParseCharProp(xmlRegParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  xmlChar *pxVar2;
  byte *pbVar3;
  xmlRegAtomPtr pxVar4;
  xmlRegAtomType type;
  undefined *puVar5;
  byte bVar6;
  ulong uVar7;
  xmlChar *pxVar8;
  
  pxVar2 = ctxt->cur;
  switch(*pxVar2) {
  case 'C':
    ctxt->cur = pxVar2 + 1;
    bVar6 = pxVar2[1];
    type = XML_REGEXP_OTHER;
    pxVar8 = (xmlChar *)0x0;
    if (bVar6 < 0x6e) {
      if (bVar6 == 99) {
        type = XML_REGEXP_OTHER_CONTROL;
      }
      else {
        if (bVar6 != 0x66) goto LAB_001ace23;
        type = XML_REGEXP_OTHER_FORMAT;
      }
    }
    else if (bVar6 == 0x6e) {
      type = XML_REGEXP_OTHER_NA;
    }
    else {
      if (bVar6 != 0x6f) goto LAB_001ace23;
      type = XML_REGEXP_OTHER_PRIVATE;
    }
    break;
  case 'D':
  case 'E':
  case 'F':
  case 'G':
  case 'H':
  case 'J':
  case 'K':
  case 'O':
  case 'Q':
  case 'R':
switchD_001acb72_caseD_44:
    ctxt->error = 0x5aa;
    xmlRegexpErrCompile(ctxt,"Unknown char property");
    return;
  case 'I':
    ctxt->cur = pxVar2 + 1;
    xVar1 = pxVar2[1];
    if (xVar1 == 's') {
      pxVar8 = pxVar2 + 2;
      ctxt->cur = pxVar8;
      bVar6 = pxVar2[2];
      if (((byte)((bVar6 & 0xdf) + 0xbf) < 0x1a) || (bVar6 == 0x2d || (byte)(bVar6 - 0x30) < 10)) {
        pbVar3 = ctxt->cur;
        do {
          do {
            pbVar3 = pbVar3 + 1;
            ctxt->cur = pbVar3;
            bVar6 = *pbVar3;
          } while ((byte)((bVar6 & 0xdf) + 0xbf) < 0x1a);
        } while (bVar6 == 0x2d || (byte)(bVar6 - 0x30) < 10);
      }
      pxVar8 = xmlStrndup(pxVar8,*(int *)&ctxt->cur - (int)pxVar8);
      type = XML_REGEXP_BLOCK_NAME;
    }
    else {
      ctxt->error = 0x5aa;
      xmlRegexpErrCompile(ctxt,"IsXXXX expected");
      type = 0;
      pxVar8 = (xmlChar *)0x0;
    }
    if (xVar1 != 's') {
      return;
    }
    goto LAB_001ace23;
  case 'L':
    ctxt->cur = pxVar2 + 1;
    bVar6 = pxVar2[1] + 0x94;
    type = XML_REGEXP_LETTER;
    if ((bVar6 < 10) && (uVar7 = (ulong)bVar6, (0x30bU >> (bVar6 & 0x1f) & 1) != 0)) {
      puVar5 = &DAT_00203888;
LAB_001acd8f:
      type = *(xmlRegAtomType *)(puVar5 + uVar7 * 4);
      break;
    }
    goto LAB_001ace20;
  case 'M':
    ctxt->cur = pxVar2 + 1;
    xVar1 = pxVar2[1];
    if (xVar1 == 'n') {
      type = XML_REGEXP_MARK_NONSPACING;
    }
    else if (xVar1 == 'e') {
      type = XML_REGEXP_MARK_ENCLOSING;
    }
    else {
      if (xVar1 != 'c') {
        pxVar8 = (xmlChar *)0x0;
        type = XML_REGEXP_MARK;
        goto LAB_001ace23;
      }
      type = XML_REGEXP_MARK_SPACECOMBINING;
    }
    break;
  case 'N':
    ctxt->cur = pxVar2 + 1;
    xVar1 = pxVar2[1];
    if (xVar1 == 'd') {
      type = XML_REGEXP_NUMBER_DECIMAL;
    }
    else if (xVar1 == 'o') {
      type = XML_REGEXP_NUMBER_OTHERS;
    }
    else {
      if (xVar1 != 'l') {
        pxVar8 = (xmlChar *)0x0;
        type = XML_REGEXP_NUMBER;
        goto LAB_001ace23;
      }
      type = XML_REGEXP_NUMBER_LETTER;
    }
    break;
  case 'P':
    ctxt->cur = pxVar2 + 1;
    bVar6 = pxVar2[1] + 0x9d;
    type = XML_REGEXP_PUNCT;
    if ((bVar6 < 0x11) && (uVar7 = (ulong)bVar6, (0x1104fU >> (bVar6 & 0x1f) & 1) != 0)) {
      puVar5 = &DAT_002038b0;
      goto LAB_001acd8f;
    }
    goto LAB_001ace20;
  case 'S':
    ctxt->cur = pxVar2 + 1;
    bVar6 = (byte)(pxVar2[1] + 0x9d) >> 1 | (pxVar2[1] + 0x9d) * -0x80;
    type = XML_REGEXP_SYMBOL;
    if ((bVar6 < 7) && (uVar7 = (ulong)bVar6, (0x71U >> (bVar6 & 0x1f) & 1) != 0)) {
      puVar5 = &DAT_002038f4;
      goto LAB_001acd8f;
    }
    goto LAB_001ace20;
  default:
    if (*pxVar2 != 'Z') goto switchD_001acb72_caseD_44;
    ctxt->cur = pxVar2 + 1;
    xVar1 = pxVar2[1];
    if (xVar1 == 's') {
      type = XML_REGEXP_SEPAR_SPACE;
    }
    else if (xVar1 == 'p') {
      type = XML_REGEXP_SEPAR_PARA;
    }
    else {
      if (xVar1 != 'l') {
        pxVar8 = (xmlChar *)0x0;
        type = XML_REGEXP_SEPAR;
        goto LAB_001ace23;
      }
      type = XML_REGEXP_SEPAR_LINE;
    }
  }
  ctxt->cur = pxVar2 + 2;
LAB_001ace20:
  pxVar8 = (xmlChar *)0x0;
LAB_001ace23:
  pxVar4 = ctxt->atom;
  if (pxVar4 == (xmlRegAtomPtr)0x0) {
    pxVar4 = xmlRegNewAtom(ctxt,type);
    ctxt->atom = pxVar4;
    if (pxVar4 != (xmlRegAtomPtr)0x0) {
      pxVar4->valuep = pxVar8;
    }
  }
  else if (pxVar4->type == XML_REGEXP_RANGES) {
    xmlRegAtomAddRange(ctxt,pxVar4,ctxt->neg,type,0,0,pxVar8);
  }
  return;
}

Assistant:

static void
xmlFAParseCharProp(xmlRegParserCtxtPtr ctxt) {
    int cur;
    xmlRegAtomType type = (xmlRegAtomType) 0;
    xmlChar *blockName = NULL;

    cur = CUR;
    if (cur == 'L') {
	NEXT;
	cur = CUR;
	if (cur == 'u') {
	    NEXT;
	    type = XML_REGEXP_LETTER_UPPERCASE;
	} else if (cur == 'l') {
	    NEXT;
	    type = XML_REGEXP_LETTER_LOWERCASE;
	} else if (cur == 't') {
	    NEXT;
	    type = XML_REGEXP_LETTER_TITLECASE;
	} else if (cur == 'm') {
	    NEXT;
	    type = XML_REGEXP_LETTER_MODIFIER;
	} else if (cur == 'o') {
	    NEXT;
	    type = XML_REGEXP_LETTER_OTHERS;
	} else {
	    type = XML_REGEXP_LETTER;
	}
    } else if (cur == 'M') {
	NEXT;
	cur = CUR;
	if (cur == 'n') {
	    NEXT;
	    /* nonspacing */
	    type = XML_REGEXP_MARK_NONSPACING;
	} else if (cur == 'c') {
	    NEXT;
	    /* spacing combining */
	    type = XML_REGEXP_MARK_SPACECOMBINING;
	} else if (cur == 'e') {
	    NEXT;
	    /* enclosing */
	    type = XML_REGEXP_MARK_ENCLOSING;
	} else {
	    /* all marks */
	    type = XML_REGEXP_MARK;
	}
    } else if (cur == 'N') {
	NEXT;
	cur = CUR;
	if (cur == 'd') {
	    NEXT;
	    /* digital */
	    type = XML_REGEXP_NUMBER_DECIMAL;
	} else if (cur == 'l') {
	    NEXT;
	    /* letter */
	    type = XML_REGEXP_NUMBER_LETTER;
	} else if (cur == 'o') {
	    NEXT;
	    /* other */
	    type = XML_REGEXP_NUMBER_OTHERS;
	} else {
	    /* all numbers */
	    type = XML_REGEXP_NUMBER;
	}
    } else if (cur == 'P') {
	NEXT;
	cur = CUR;
	if (cur == 'c') {
	    NEXT;
	    /* connector */
	    type = XML_REGEXP_PUNCT_CONNECTOR;
	} else if (cur == 'd') {
	    NEXT;
	    /* dash */
	    type = XML_REGEXP_PUNCT_DASH;
	} else if (cur == 's') {
	    NEXT;
	    /* open */
	    type = XML_REGEXP_PUNCT_OPEN;
	} else if (cur == 'e') {
	    NEXT;
	    /* close */
	    type = XML_REGEXP_PUNCT_CLOSE;
	} else if (cur == 'i') {
	    NEXT;
	    /* initial quote */
	    type = XML_REGEXP_PUNCT_INITQUOTE;
	} else if (cur == 'f') {
	    NEXT;
	    /* final quote */
	    type = XML_REGEXP_PUNCT_FINQUOTE;
	} else if (cur == 'o') {
	    NEXT;
	    /* other */
	    type = XML_REGEXP_PUNCT_OTHERS;
	} else {
	    /* all punctuation */
	    type = XML_REGEXP_PUNCT;
	}
    } else if (cur == 'Z') {
	NEXT;
	cur = CUR;
	if (cur == 's') {
	    NEXT;
	    /* space */
	    type = XML_REGEXP_SEPAR_SPACE;
	} else if (cur == 'l') {
	    NEXT;
	    /* line */
	    type = XML_REGEXP_SEPAR_LINE;
	} else if (cur == 'p') {
	    NEXT;
	    /* paragraph */
	    type = XML_REGEXP_SEPAR_PARA;
	} else {
	    /* all separators */
	    type = XML_REGEXP_SEPAR;
	}
    } else if (cur == 'S') {
	NEXT;
	cur = CUR;
	if (cur == 'm') {
	    NEXT;
	    type = XML_REGEXP_SYMBOL_MATH;
	    /* math */
	} else if (cur == 'c') {
	    NEXT;
	    type = XML_REGEXP_SYMBOL_CURRENCY;
	    /* currency */
	} else if (cur == 'k') {
	    NEXT;
	    type = XML_REGEXP_SYMBOL_MODIFIER;
	    /* modifiers */
	} else if (cur == 'o') {
	    NEXT;
	    type = XML_REGEXP_SYMBOL_OTHERS;
	    /* other */
	} else {
	    /* all symbols */
	    type = XML_REGEXP_SYMBOL;
	}
    } else if (cur == 'C') {
	NEXT;
	cur = CUR;
	if (cur == 'c') {
	    NEXT;
	    /* control */
	    type = XML_REGEXP_OTHER_CONTROL;
	} else if (cur == 'f') {
	    NEXT;
	    /* format */
	    type = XML_REGEXP_OTHER_FORMAT;
	} else if (cur == 'o') {
	    NEXT;
	    /* private use */
	    type = XML_REGEXP_OTHER_PRIVATE;
	} else if (cur == 'n') {
	    NEXT;
	    /* not assigned */
	    type = XML_REGEXP_OTHER_NA;
	} else {
	    /* all others */
	    type = XML_REGEXP_OTHER;
	}
    } else if (cur == 'I') {
	const xmlChar *start;
	NEXT;
	cur = CUR;
	if (cur != 's') {
	    ERROR("IsXXXX expected");
	    return;
	}
	NEXT;
	start = ctxt->cur;
	cur = CUR;
	if (((cur >= 'a') && (cur <= 'z')) ||
	    ((cur >= 'A') && (cur <= 'Z')) ||
	    ((cur >= '0') && (cur <= '9')) ||
	    (cur == 0x2D)) {
	    NEXT;
	    cur = CUR;
	    while (((cur >= 'a') && (cur <= 'z')) ||
		((cur >= 'A') && (cur <= 'Z')) ||
		((cur >= '0') && (cur <= '9')) ||
		(cur == 0x2D)) {
		NEXT;
		cur = CUR;
	    }
	}
	type = XML_REGEXP_BLOCK_NAME;
	blockName = xmlStrndup(start, ctxt->cur - start);
    } else {
	ERROR("Unknown char property");
	return;
    }
    if (ctxt->atom == NULL) {
	ctxt->atom = xmlRegNewAtom(ctxt, type);
	if (ctxt->atom != NULL)
	    ctxt->atom->valuep = blockName;
    } else if (ctxt->atom->type == XML_REGEXP_RANGES) {
        xmlRegAtomAddRange(ctxt, ctxt->atom, ctxt->neg,
		           type, 0, 0, blockName);
    }
}